

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O3

wchar_t project_player_handler_POIS(project_player_handler_context_t *context)

{
  player *p;
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t wVar3;
  source origin;
  source sVar4;
  
  p = player;
  uVar2 = Rand_div(context->dam);
  _Var1 = player_inc_timed(p,L'\a',uVar2 + L'\v',true,true,true);
  if (!_Var1) {
    msg("You resist the effect!");
  }
  wVar3 = L'\0';
  if (L';' < context->power) {
    uVar2 = Rand_div(context->dam);
    wVar3 = L'\0';
    if (200 < (int)uVar2) {
      wVar3 = L'\0';
      _Var1 = player_is_immune(player,L'\0');
      if (!_Var1) {
        wVar3 = context->dam / 5;
        msg("The venom stings your skin!");
        inven_damage(player,L'\0',wVar3);
        wVar3 = adjust_dam(player,L'\0',wVar3,RANDOMISE,(int)(player->state).el_info[0].res_level,
                           true);
      }
    }
    uVar2 = Rand_div(context->dam);
    if (200 < (int)uVar2) {
      msg("The stench sickens you.");
      sVar4 = source_none();
      origin.which = sVar4.which;
      origin._4_4_ = 0;
      origin.what = sVar4.what;
      effect_simple(L'\x11',origin,"0",L'\x04',L'\0',L'\0',L'\0',L'\0',&context->obvious);
    }
  }
  return wVar3;
}

Assistant:

static int project_player_handler_POIS(project_player_handler_context_t *context)
{
	int xtra = 0;

	if (!player_inc_timed(player, TMD_POISONED, 10 + randint1(context->dam),
			true, true, true)) {
		msg("You resist the effect!");
	}

	/* Occasional side-effects for powerful poison attacks */
	if (context->power >= 60) {
		if (randint0(context->dam) > 200) {
			if (!player_is_immune(player, ELEM_ACID)) {
				int dam = context->dam / 5;
				msg("The venom stings your skin!");
				inven_damage(player, PROJ_ACID, dam);
				xtra += adjust_dam(player, PROJ_ACID, dam, RANDOMISE,
								 player->state.el_info[PROJ_ACID].res_level,
								 true);
			}
		}
		if (randint0(context->dam) > 200) {
			msg("The stench sickens you.");
			effect_simple(EF_DRAIN_STAT, source_none(), "0", STAT_CON, 0, 0, 0,
						  0, &context->obvious);
		}
	}
	return xtra;
}